

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O1

void absl::lts_20240722::cord_internal::anon_unknown_0::
     AnalyzeDataEdge<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)1>
               (CordRepRef<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)1> rep,
               RawUsage<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)1>
               *raw_usage)

{
  byte bVar1;
  long lVar2;
  sbyte sVar3;
  CordRepRef<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)1> CVar4;
  int iVar5;
  sbyte sVar6;
  int iVar7;
  
  if (rep.rep == (Nonnull<const_CordRep_*>)0x0) {
    __assert_fail("edge != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/internal/cord_data_edge.h"
                  ,0x21,"bool absl::cord_internal::IsDataEdge(const CordRep *)");
  }
  bVar1 = (rep.rep)->tag;
  if (bVar1 < 5) {
    CVar4.rep = rep.rep;
    if (bVar1 == 1) {
      CVar4.rep = *(Nonnull<const_CordRep_*> *)&rep.rep[1].refcount;
    }
    if ((CVar4.rep)->tag < 5) {
      __assert_fail("IsDataEdge(rep.rep)",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/cord_analysis.cc"
                    ,0x78,
                    "void absl::cord_internal::(anonymous namespace)::AnalyzeDataEdge(CordRepRef<mode>, RawUsage<mode> &) [mode = absl::cord_internal::(anonymous namespace)::Mode::kTotal]"
                   );
    }
  }
  if (bVar1 == 1) {
    raw_usage->total = raw_usage->total + 0x20;
    rep.rep = *(Nonnull<const_CordRep_*> *)&rep.rep[1].refcount;
  }
  bVar1 = (rep.rep)->tag;
  if (bVar1 < 6) {
    lVar2 = (rep.rep)->length + 0x28;
  }
  else {
    if ((bVar1 - 0xf9 < 7) || (bVar1 < 6)) {
      __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                    ,0xbb,"const CordRepFlat *absl::cord_internal::CordRep::flat() const");
    }
    iVar5 = -0xb8000;
    if (bVar1 < 0xbb) {
      iVar5 = -0xe80;
    }
    sVar6 = 0xc;
    if (bVar1 < 0xbb) {
      sVar6 = 6;
    }
    iVar7 = -0x10;
    if (0x42 < bVar1) {
      iVar7 = iVar5;
    }
    sVar3 = 3;
    if (0x42 < bVar1) {
      sVar3 = sVar6;
    }
    lVar2 = (long)(int)(((uint)bVar1 << sVar3) + iVar7);
  }
  raw_usage->total = raw_usage->total + lVar2;
  return;
}

Assistant:

void AnalyzeDataEdge(CordRepRef<mode> rep, RawUsage<mode>& raw_usage) {
  assert(IsDataEdge(rep.rep));

  // Consume all substrings
  if (rep.rep->tag == SUBSTRING) {
    raw_usage.Add(sizeof(CordRepSubstring), rep);
    rep = rep.Child(rep.rep->substring()->child);
  }

  // Consume FLAT / EXTERNAL
  const size_t size =
      rep.rep->tag >= FLAT
          ? rep.rep->flat()->AllocatedSize()
          : rep.rep->length + sizeof(CordRepExternalImpl<intptr_t>);
  raw_usage.Add(size, rep);
}